

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

uint format_Bpp(format_t format)

{
  uint local_c;
  format_t format_local;
  
  switch(format) {
  default:
    fprintf(_stderr,"%s: unknown format: %u\n",argv0,(ulong)format);
    if (option_force == 0) {
      abort();
    }
    local_c = 1;
    break;
  case FORMAT_RGB565:
  case FORMAT_ARGB4444:
    local_c = 2;
    break;
  case FORMAT_GRAY8:
    local_c = 1;
    break;
  case 0xffffffff:
  case FORMAT_BGRA8888:
    local_c = 4;
  }
  return local_c;
}

Assistant:

unsigned int
format_Bpp(
    format_t format)
{
    switch ((int)format) {
    case FORMAT_RGBA8888:
    case FORMAT_BGRA8888:
        return 4;
    case FORMAT_ARGB4444:
    case FORMAT_RGB565:
        return 2;
    case FORMAT_GRAY8:
        return 1;
    default:
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        if (!option_force) abort();
        return 1;
    }
}